

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_visitor.hpp
# Opt level: O1

bool duckdb::TypeVisitor::Contains<bool(&)(duckdb::LogicalType_const&)>
               (LogicalType *type,_func_bool_LogicalType_ptr *predicate)

{
  pointer ppVar1;
  bool bVar2;
  bool bVar3;
  LogicalType *pLVar4;
  child_list_t<LogicalType> *pcVar5;
  LogicalType *type_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *child;
  pointer ppVar6;
  child_list_t<LogicalType> local_38;
  
  do {
    bVar2 = (*predicate)(type);
    if (bVar2) {
      return true;
    }
    switch(type->id_) {
    case STRUCT:
      pcVar5 = StructType::GetChildTypes_abi_cxx11_(type);
      ppVar6 = (pcVar5->
               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               ).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar1 = (pcVar5->
               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               ).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar2 = ppVar6 != ppVar1;
      if (!bVar2) {
        return bVar2;
      }
      bVar3 = Contains<bool(&)(duckdb::LogicalType_const&)>(&ppVar6->second,predicate);
      if (bVar3) {
        return bVar2;
      }
      pLVar4 = &ppVar6[1].second;
      do {
        bVar3 = (pointer)&pLVar4[-2].type_info_.internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount == ppVar1;
        bVar2 = !bVar3;
        if (bVar3) {
          return bVar2;
        }
        bVar3 = Contains<bool(&)(duckdb::LogicalType_const&)>(pLVar4,predicate);
        pLVar4 = (LogicalType *)&pLVar4[2].type_info_;
      } while (!bVar3);
      return bVar2;
    case LIST:
      type = ListType::GetChildType(type);
      break;
    case MAP:
      pLVar4 = MapType::KeyType(type);
      bVar2 = Contains<bool(&)(duckdb::LogicalType_const&)>(pLVar4,predicate);
      if (bVar2) {
        return true;
      }
      type = MapType::ValueType(type);
      break;
    default:
      return false;
    case UNION:
      UnionType::CopyMemberTypes_abi_cxx11_(&local_38,(UnionType *)type,type_00);
      ppVar6 = local_38.
               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               .
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      while ((ppVar6 != local_38.
                        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                        .
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish &&
             (bVar2 = Contains<bool(&)(duckdb::LogicalType_const&)>(&ppVar6->second,predicate),
             !bVar2))) {
        ppVar6 = ppVar6 + 1;
      }
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)&local_38);
      return ppVar6 != local_38.
                       super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                       .
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
    case ARRAY:
      type = ArrayType::GetChildType(type);
    }
  } while( true );
}

Assistant:

inline bool TypeVisitor::Contains(const LogicalType &type, F &&predicate) {
	if (predicate(type)) {
		return true;
	}
	switch (type.id()) {
	case LogicalTypeId::STRUCT: {
		for (const auto &child : StructType::GetChildTypes(type)) {
			if (Contains(child.second, predicate)) {
				return true;
			}
		}
		return false;
	}
	case LogicalTypeId::UNION:
		for (const auto &child : UnionType::CopyMemberTypes(type)) {
			if (Contains(child.second, predicate)) {
				return true;
			}
		}
		return false;
	case LogicalTypeId::LIST:
		return Contains(ListType::GetChildType(type), predicate);
	case LogicalTypeId::ARRAY:
		return Contains(ArrayType::GetChildType(type), predicate);
	case LogicalTypeId::MAP:
		return Contains(MapType::KeyType(type), predicate) || Contains(MapType::ValueType(type), predicate);
	default:
		return false;
	}
}